

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

void Mio_LibraryShortNames(Mio_Library_t *pLib)

{
  uint uVar1;
  Mio_Gate_t *pCell;
  char *pcVar2;
  Mio_Pin_t *pPin;
  uint uVar3;
  byte bVar4;
  char Buffer [10000];
  
  uVar1 = Mio_LibraryReadGateNum(pLib);
  if (1 < uVar1) {
    uVar3 = uVar1 - 1;
    uVar1 = 0;
    for (; uVar3 != 0; uVar3 = uVar3 / 10) {
      uVar1 = uVar1 + 1;
    }
  }
  pCell = Mio_LibraryReadGates(pLib);
  uVar3 = 0;
  for (; pCell != (Mio_Gate_t *)0x0; pCell = Mio_GateReadNext(pCell)) {
    if (pCell->pName != (char *)0x0) {
      free(pCell->pName);
      pCell->pName = (char *)0x0;
    }
    uVar3 = uVar3 + 1;
    sprintf(Buffer,"g%0*d",(ulong)uVar1,(ulong)uVar3);
    pcVar2 = Abc_UtilStrsav(Buffer);
    pCell->pName = pcVar2;
    Mio_LibraryShortFormula(pCell,pCell->pForm,Buffer);
    if (pCell->pForm != (char *)0x0) {
      free(pCell->pForm);
      pCell->pForm = (char *)0x0;
    }
    pcVar2 = Abc_UtilStrsav(Buffer);
    pCell->pForm = pcVar2;
    pPin = Mio_GateReadPins(pCell);
    bVar4 = 0x61;
    while (pPin != (Mio_Pin_t *)0x0) {
      if (pPin->pName != (char *)0x0) {
        free(pPin->pName);
        pPin->pName = (char *)0x0;
      }
      Buffer[1] = '\0';
      Buffer[0] = bVar4;
      pcVar2 = Abc_UtilStrsav(Buffer);
      pPin->pName = pcVar2;
      pPin = Mio_PinReadNext(pPin);
      bVar4 = bVar4 + 1;
    }
    if (pCell->pOutName != (char *)0x0) {
      free(pCell->pOutName);
      pCell->pOutName = (char *)0x0;
    }
    Buffer[0] = 'z';
    Buffer[1] = '\0';
    pcVar2 = Abc_UtilStrsav(Buffer);
    pCell->pOutName = pcVar2;
  }
  Mio_LibraryHashGates(pLib);
  pcVar2 = pLib->pName;
  uVar1 = Mio_LibraryReadGateNum(pLib);
  printf("Renaming library \"%s\" into \"%s%d\".\n",pcVar2,"lib",(ulong)uVar1);
  if (pLib->pName != (char *)0x0) {
    free(pLib->pName);
    pLib->pName = (char *)0x0;
  }
  uVar1 = Mio_LibraryReadGateNum(pLib);
  sprintf(Buffer,"lib%d",(ulong)uVar1);
  pcVar2 = Abc_UtilStrsav(Buffer);
  pLib->pName = pcVar2;
  return;
}

Assistant:

void Mio_LibraryShortNames( Mio_Library_t * pLib )
{
    char Buffer[10000];
    Mio_Gate_t * pGate; Mio_Pin_t * pPin;
    int c = 0, i, nDigits = Abc_Base10Log( Mio_LibraryReadGateNum(pLib) );
    // itereate through classes
    Mio_LibraryForEachGate( pLib, pGate )
    {
        ABC_FREE( pGate->pName );
        sprintf( Buffer, "g%0*d", nDigits, ++c );
        pGate->pName = Abc_UtilStrsav( Buffer );
        // update formula
        Mio_LibraryShortFormula( pGate, pGate->pForm, Buffer );
        ABC_FREE( pGate->pForm );
        pGate->pForm = Abc_UtilStrsav( Buffer );
        // pin names
        i = 0;
        Mio_GateForEachPin( pGate, pPin )
        {
            ABC_FREE( pPin->pName );
            sprintf( Buffer, "%c", 'a'+i );
            pPin->pName = Abc_UtilStrsav( Buffer );
            i++;
        }
        // output pin
        ABC_FREE( pGate->pOutName );
        sprintf( Buffer, "z" );
        pGate->pOutName = Abc_UtilStrsav( Buffer );
    }
    Mio_LibraryHashGates( pLib );
    // update library name
    printf( "Renaming library \"%s\" into \"%s%d\".\n", pLib->pName, "lib", Mio_LibraryReadGateNum(pLib) );
    ABC_FREE( pLib->pName );
    sprintf( Buffer, "lib%d", Mio_LibraryReadGateNum(pLib) );
    pLib->pName = Abc_UtilStrsav( Buffer );
}